

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cCopyImageTests.cpp
# Opt level: O2

bool gl4cts::CopyImage::compareR11FG11FB10F(void *ptr1,void *ptr2,int num)

{
  float *pfVar1;
  long lVar2;
  int j;
  long lVar3;
  uint uVar4;
  ulong uVar5;
  ulong uVar6;
  float value2 [3];
  float value1 [3];
  float local_48 [6];
  
  uVar4 = num >> 2;
  uVar5 = 0;
  uVar6 = 0;
  if (0 < (int)uVar4) {
    uVar6 = (ulong)uVar4;
  }
  for (; uVar5 != uVar6; uVar5 = uVar5 + 1) {
    r11fg11fb10f_to_float3(*(r11fg11fb10f *)((long)ptr1 + uVar5 * 4),local_48 + 3);
    r11fg11fb10f_to_float3(*(r11fg11fb10f *)((long)ptr2 + uVar5 * 4),local_48);
    lVar3 = 0;
    while (lVar3 != 3) {
      lVar2 = lVar3 + 3;
      pfVar1 = local_48 + lVar3;
      lVar3 = lVar3 + 1;
      if ((local_48[lVar2] != *pfVar1) || (NAN(local_48[lVar2]) || NAN(*pfVar1))) goto LAB_00949e5c;
    }
  }
LAB_00949e5c:
  return (long)(int)uVar4 <= (long)uVar5;
}

Assistant:

bool compareR11FG11FB10F(const void* ptr1, const void* ptr2, int num)
{
	r11fg11fb10f* data1 = (r11fg11fb10f*)ptr1;
	r11fg11fb10f* data2 = (r11fg11fb10f*)ptr2;

	float value1[3];
	float value2[3];

	for (int i = 0; i<num>> 2; ++i)
	{
		r11fg11fb10f_to_float3(data1[i], value1);
		r11fg11fb10f_to_float3(data2[i], value2);

		for (int j = 0; j < 3; ++j)
		{
			if (value1[j] != value2[j])
			{
				return false;
			}
		}
	}
	return true;
}